

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_sub_int(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint c,size_t limbs)

{
  size_t sVar1;
  mbedtls_mpi_uint mVar2;
  
  for (sVar1 = 0; limbs != sVar1; sVar1 = sVar1 + 1) {
    mVar2 = A[sVar1] - c;
    c = (mbedtls_mpi_uint)(A[sVar1] < c);
    X[sVar1] = mVar2;
  }
  return c;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_sub_int(mbedtls_mpi_uint *X,
                                          const mbedtls_mpi_uint *A,
                                          mbedtls_mpi_uint c,  /* doubles as carry */
                                          size_t limbs)
{
    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint s = A[i];
        mbedtls_mpi_uint t = s - c;
        c = (t > s);
        X[i] = t;
    }

    return c;
}